

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextHtmlExporter::emitAlignment(QTextHtmlExporter *this,Alignment align)

{
  QLatin1StringView s;
  Int IVar1;
  QFlags<Qt::AlignmentFlag> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QLatin1StringView QVar3;
  undefined4 in_stack_ffffffffffffff98;
  AlignmentFlag in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_18;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_14;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&(in_RDI,in_stack_ffffffffffffff9c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar1 == 0) {
    local_14.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&(in_RDI,in_stack_ffffffffffffff9c);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar1 == 0) {
      local_18.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&(in_RDI,in_stack_ffffffffffffff9c);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      if (IVar1 == 0) {
        local_1c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&(in_RDI,in_stack_ffffffffffffff9c);
        IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
        if (IVar1 != 0) {
          QVar3 = Qt::Literals::StringLiterals::operator____L1
                            (in_stack_ffffffffffffffa8,(size_t)in_RDI);
          QVar2.m_data = in_stack_ffffffffffffffb8;
          QVar2.m_size = (qsizetype)QVar3.m_data;
          QString::operator+=((QString *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),QVar2);
        }
      }
      else {
        QVar2 = Qt::Literals::StringLiterals::operator____L1
                          (in_stack_ffffffffffffffa8,(size_t)in_RDI);
        QVar3.m_data = (char *)QVar2.m_size;
        QVar3.m_size = in_stack_ffffffffffffffb0;
        QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                            ,QVar3);
      }
    }
    else {
      Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffa8,(size_t)in_RDI);
      s.m_data = in_stack_ffffffffffffffb8;
      s.m_size = in_stack_ffffffffffffffb0;
      QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),s
                         );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitAlignment(Qt::Alignment align)
{
    if (align & Qt::AlignLeft)
        return;
    else if (align & Qt::AlignRight)
        html += " align=\"right\""_L1;
    else if (align & Qt::AlignHCenter)
        html += " align=\"center\""_L1;
    else if (align & Qt::AlignJustify)
        html += " align=\"justify\""_L1;
}